

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

ON_ModelComponentReference __thiscall
ONX_Model::AddModelComponentForExperts
          (ONX_Model *this,ON_ModelComponent *model_component,bool bManagedComponent,
          bool bResolveIdAndNameConflicts,bool bUpdateComponentIdentification)

{
  Type component_type;
  bool bVar1;
  ON_UUID *pOVar2;
  wchar_t *candidate_name;
  undefined7 in_register_00000009;
  char *sFormat;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int line_number;
  byte in_R9B;
  ON_ModelComponentReference OVar4;
  ON_UUID name_parent_id;
  ON_UUID id_00;
  ON_wString name;
  ON_UUID id;
  ON_UUID parent_id;
  ON_wString local_80;
  undefined1 local_78 [24];
  uchar auStack_60 [8];
  ON_UUID *local_50;
  ON_wString *local_48;
  uchar auStack_40 [8];
  
  id_00._0_8_ = (ON_ModelComponent *)CONCAT71(in_register_00000011,bManagedComponent);
  if (id_00._0_8_ == (ON_ModelComponent *)0x0) {
    sFormat = "model_component parameter is nullptr.";
    line_number = 0x59c;
  }
  else {
    local_78._12_4_ = (undefined4)CONCAT71(in_register_00000009,bResolveIdAndNameConflicts);
    component_type = ON_ModelComponent::ComponentType(id_00._0_8_);
    bVar1 = ON_ModelComponent::ComponentTypeIsValidAndNotMixed(component_type);
    if (bVar1) {
      pOVar2 = ON_ModelComponent::ParentId(id_00._0_8_);
      local_48 = *(ON_wString **)pOVar2;
      auStack_40 = *&pOVar2->Data4;
      local_78._16_4_ = 0;
      local_78._20_2_ = 0;
      local_78._22_2_ = 0;
      auStack_60[0] = '\0';
      auStack_60[1] = '\0';
      auStack_60[2] = '\0';
      auStack_60[3] = '\0';
      auStack_60[4] = '\0';
      auStack_60[5] = '\0';
      auStack_60[6] = '\0';
      auStack_60[7] = '\0';
      ON_wString::ON_wString(&local_80);
      local_50 = ON_ModelComponent::Id(id_00._0_8_);
      ON_ModelComponent::Name((ON_ModelComponent *)local_78);
      candidate_name = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_78);
      bVar1 = ValdateComponentIdAndName
                        ((ONX_Model *)model_component,component_type,local_50,(ON_UUID *)&local_48,
                         candidate_name,bUpdateComponentIdentification,
                         (bool)(bUpdateComponentIdentification & in_R9B),
                         (ON_UUID *)(local_78 + 0x10),&local_80);
      ON_wString::~ON_wString((ON_wString *)local_78);
      if (bVar1) {
        name_parent_id.Data4 = (uchar  [8])&local_80;
        name_parent_id._0_8_ = auStack_60;
        id_00.Data4[0] = local_78[0x10];
        id_00.Data4[1] = local_78[0x11];
        id_00.Data4[2] = local_78[0x12];
        id_00.Data4[3] = local_78[0x13];
        id_00.Data4[4] = local_78[0x14];
        id_00.Data4[5] = local_78[0x15];
        id_00.Data4[6] = local_78[0x16];
        id_00.Data4[7] = local_78[0x17];
        Internal_AddModelComponent
                  (this,model_component,id_00,name_parent_id,local_48,auStack_40[0],
                   SUB41(local_78._12_4_,0));
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
                   ,0x5ac,"","Invalid model_component id or name.");
        ON_ModelComponentReference::ON_ModelComponentReference
                  ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
      }
      ON_wString::~ON_wString(&local_80);
      _Var3._M_pi = extraout_RDX_00;
      goto LAB_004842e6;
    }
    sFormat = "Invalid model_component->ComponentType() value.";
    line_number = 0x5a3;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_extensions.cpp"
             ,line_number,"",sFormat);
  ON_ModelComponentReference::ON_ModelComponentReference
            ((ON_ModelComponentReference *)this,&ON_ModelComponentReference::Empty);
  _Var3._M_pi = extraout_RDX;
LAB_004842e6:
  OVar4.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  OVar4.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ON_ModelComponentReference)
         OVar4.m_sp.super___shared_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ON_ModelComponentReference ONX_Model::AddModelComponentForExperts(
  ON_ModelComponent* model_component,
  bool bManagedComponent,
  bool bResolveIdAndNameConflicts,
  bool bUpdateComponentIdentification
  )
{
  if (nullptr == model_component)
  {
    ON_ERROR("model_component parameter is nullptr.");
    return ON_ModelComponentReference::Empty;
  }

  const ON_ModelComponent::Type component_type = model_component->ComponentType();
  if (!ON_ModelComponent::ComponentTypeIsValidAndNotMixed(component_type))
  {
    ON_ERROR("Invalid model_component->ComponentType() value.");
    return ON_ModelComponentReference::Empty;
  }

  const ON_UUID parent_id = model_component->ParentId();
  ON_UUID id = ON_nil_uuid;
  ON_wString name;
  if (false == ValdateComponentIdAndName(component_type, model_component->Id(), parent_id, model_component->Name(), bResolveIdAndNameConflicts, bResolveIdAndNameConflicts && bUpdateComponentIdentification, id, name))
  {
    ON_ERROR("Invalid model_component id or name.");
    return ON_ModelComponentReference::Empty;
  }

  return Internal_AddModelComponent(model_component, id, parent_id, name, bManagedComponent, bUpdateComponentIdentification);
}